

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void SerializePrimitives(CJSON *json)

{
  ostream *poVar1;
  PrimitiveTestClass ptc;
  string sStack_138;
  PrimitiveTestClass local_118;
  
  local_118.SIZE = 10;
  memset(&local_118.str,0,0x98);
  PrimitiveTestClass::AddValues(&local_118);
  poVar1 = std::operator<<((ostream *)&std::cout,"PrimitiveTestClass: ");
  CJSON::Serialize<PrimitiveTestClass,_nullptr>(&sStack_138,json,&local_118);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_138);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_138);
  PrimitiveTestClass::~PrimitiveTestClass(&local_118);
  return;
}

Assistant:

void SerializePrimitives(CJSON &json)
{
    PrimitiveTestClass ptc;
    ptc.AddValues();

    cout << "PrimitiveTestClass: " << json.Serialize(ptc) << endl;
}